

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# report.c
# Opt level: O0

void pcut_report_test_done_unparsed
               (pcut_item_t *test,int outcome,char *unparsed_output,size_t unparsed_output_size)

{
  size_t unparsed_output_size_local;
  char *unparsed_output_local;
  int outcome_local;
  pcut_item_t *test_local;
  
  parse_command_output
            (unparsed_output,unparsed_output_size,buffer_for_extra_output,0x1000,
             buffer_for_error_messages,0x1000);
  pcut_report_test_done(test,outcome,buffer_for_error_messages,(char *)0x0,buffer_for_extra_output);
  return;
}

Assistant:

void pcut_report_test_done_unparsed(pcut_item_t *test, int outcome,
		const char *unparsed_output, size_t unparsed_output_size) {

	parse_command_output(unparsed_output, unparsed_output_size,
			buffer_for_extra_output, BUFFER_SIZE,
			buffer_for_error_messages, BUFFER_SIZE);

	pcut_report_test_done(test, outcome, buffer_for_error_messages, NULL, buffer_for_extra_output);
}